

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void av1_init_motion_fpf(search_site_config *cfg,int stride)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int local_58;
  short local_54;
  undefined2 uStack_52;
  short local_50;
  undefined4 local_4e;
  short local_4a;
  undefined2 local_48;
  short local_46;
  short local_44;
  short local_42;
  short local_40;
  short local_3e;
  short local_3c;
  short local_3a;
  FULLPEL_MV search_site_mvs [13];
  
  cfg->site[10][0].mv.row = 0;
  cfg->site[10][0].mv.col = 0;
  cfg->site[10][0].offset = 0;
  cfg->stride = stride;
  piVar1 = &cfg->site[10][0].offset;
  uVar2 = 0x400;
  lVar4 = 10;
  iVar5 = 0;
  do {
    iVar3 = (int)((double)uVar2 * 0.41);
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    local_58 = 0;
    local_50 = (short)uVar2;
    local_54 = -local_50;
    uStack_52 = 0;
    local_4e = 0;
    local_4a = local_54;
    local_48 = 0;
    local_46 = local_50;
    local_44 = local_54;
    local_3e = (short)iVar3;
    local_42 = -local_3e;
    local_40 = local_50;
    local_3c = local_42;
    local_3a = local_50;
    search_site_mvs[0].row = local_3e;
    search_site_mvs[0].col = local_54;
    search_site_mvs[1].row = local_54;
    search_site_mvs[1].col = local_3e;
    search_site_mvs[2].row = local_50;
    search_site_mvs[2].col = local_42;
    search_site_mvs[3].row = local_3e;
    search_site_mvs[3].col = local_50;
    search_site_mvs[4].row = local_42;
    search_site_mvs[4].col = local_54;
    uVar6 = 0;
    do {
      iVar3 = (&local_58)[uVar6];
      piVar1[uVar6 * 2 + -1] = iVar3;
      piVar1[uVar6 * 2] = (iVar3 >> 0x10) + (short)iVar3 * stride;
      uVar6 = uVar6 + 1;
    } while ((uint)(uVar2 != 1) * 4 + 9 != uVar6);
    cfg->searches_per_step[lVar4] = (uint)(uVar2 != 1) * 4 + 8;
    cfg->radius[lVar4] = uVar2;
    lVar4 = lVar4 + -1;
    iVar5 = iVar5 + 1;
    uVar2 = uVar2 >> 1;
    piVar1 = piVar1 + -0x22;
  } while (iVar5 != 0xb);
  cfg->num_search_steps = 0xb;
  return;
}

Assistant:

void av1_init_motion_fpf(search_site_config *cfg, int stride) {
  int num_search_steps = 0;
  int stage_index = MAX_MVSEARCH_STEPS - 1;

  cfg->site[stage_index][0].mv.col = cfg->site[stage_index][0].mv.row = 0;
  cfg->site[stage_index][0].offset = 0;
  cfg->stride = stride;

  for (int radius = MAX_FIRST_STEP; radius > 0; radius /= 2) {
    // Generate offsets for 8 search sites per step.
    int tan_radius = AOMMAX((int)(0.41 * radius), 1);
    int num_search_pts = 12;
    if (radius == 1) num_search_pts = 8;

    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },
      { -radius, 0 },
      { radius, 0 },
      { 0, -radius },
      { 0, radius },
      { -radius, -tan_radius },
      { radius, tan_radius },
      { -tan_radius, radius },
      { tan_radius, -radius },
      { -radius, tan_radius },
      { radius, -tan_radius },
      { tan_radius, radius },
      { -tan_radius, -radius },
    };

    int i;
    for (i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    --stage_index;
    ++num_search_steps;
  }
  cfg->num_search_steps = num_search_steps;
}